

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O1

void __thiscall ACustomBridge::Destroy(ACustomBridge *this)

{
  DThinker *pDVar1;
  DObject *pDVar2;
  TThinkerIterator<AActor> it;
  FThinkerIterator FStack_28;
  
  FThinkerIterator::FThinkerIterator(&FStack_28,AActor::RegistrationInfo.MyClass,0x80);
  pDVar1 = FThinkerIterator::Next(&FStack_28,false);
  while (pDVar1 != (DThinker *)0x0) {
    pDVar2 = pDVar1[9].super_DObject.ObjNext;
    if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
      pDVar1[9].super_DObject.ObjNext = (DObject *)0x0;
      pDVar2 = (DObject *)0x0;
    }
    if (pDVar2 == (DObject *)this) {
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
    }
    pDVar1 = FThinkerIterator::Next(&FStack_28,false);
  }
  AActor::Destroy(&this->super_AActor);
  return;
}

Assistant:

void ACustomBridge::Destroy()
{
	// Hexen originally just set a flag to make the bridge balls remove themselves in A_BridgeOrbit.
	// But this is not safe with custom bridge balls that do not necessarily call that function.
	// So the best course of action is to look for all bridge balls here and destroy them ourselves.
	
	TThinkerIterator<AActor> it;
	AActor *thing;
	
	while ((thing = it.Next()))
	{
		if (thing->target == this)
		{
			thing->Destroy();
		}
	}
	Super::Destroy();
}